

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  uint uVar1;
  container_t *pcVar2;
  array_container_t *c;
  container_t *pcVar3;
  uint16_t x;
  uint8_t newtypecode;
  uint8_t local_29;
  
  x = (uint16_t)(val >> 0x10);
  uVar1 = ra_get_index(&r->high_low_container,x);
  if (-1 < (int)uVar1) {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)uVar1);
    typecode = (r->high_low_container).typecodes[uVar1 & 0xffff];
    pcVar3 = (r->high_low_container).containers[uVar1 & 0xffff];
    newtypecode = typecode;
    pcVar2 = container_add(pcVar3,(uint16_t)val,typecode,&newtypecode);
    if (pcVar2 != pcVar3) {
      container_free(pcVar3,typecode);
      (r->high_low_container).containers[uVar1] = pcVar2;
      (r->high_low_container).typecodes[uVar1] = newtypecode;
    }
    return;
  }
  c = array_container_create();
  pcVar3 = container_add(c,(uint16_t)val,'\x02',&local_29);
  ra_insert_new_key_value_at(&r->high_low_container,~uVar1,x,pcVar3,local_29);
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *container =
            ra_get_container_at_index(ra, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}